

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opencc.c
# Opt level: O0

opencc_t opencc_open(char *config_file)

{
  converter_t pvVar1;
  config_t t_config;
  dictionary_set_t pvVar2;
  config_t config;
  int retval;
  opencc_desc *opencc;
  char *config_file_local;
  
  if (lib_initialized == 0) {
    lib_initialize();
  }
  config_file_local = (char *)malloc(0x10);
  config_file_local[0] = '\0';
  config_file_local[1] = '\0';
  config_file_local[2] = '\0';
  config_file_local[3] = '\0';
  config_file_local[4] = '\0';
  config_file_local[5] = '\0';
  config_file_local[6] = '\0';
  config_file_local[7] = '\0';
  pvVar1 = converter_open();
  *(converter_t *)(config_file_local + 8) = pvVar1;
  converter_set_conversion_mode(*(converter_t *)(config_file_local + 8),OPENCC_CONVERSION_FAST);
  if (config_file != (char *)0x0) {
    t_config = config_open(config_file);
    if (t_config == (config_t)0xffffffffffffffff) {
      errnum = OPENCC_ERROR_CONFIG;
      config_file_local = (char *)0xffffffffffffffff;
    }
    else {
      pvVar2 = config_get_dictionary_set(t_config);
      *(dictionary_set_t *)config_file_local = pvVar2;
      converter_assign_dictionary
                (*(converter_t *)(config_file_local + 8),*(dictionary_set_t *)config_file_local);
      config_close(t_config);
    }
  }
  return config_file_local;
}

Assistant:

opencc_t opencc_open(const char * config_file)
{
	if (!lib_initialized)
		lib_initialize();

	opencc_desc * opencc;
	opencc = (opencc_desc *) malloc(sizeof(opencc_desc));

	opencc->dictionary_set = NULL;
	opencc->converter = converter_open();
	converter_set_conversion_mode(opencc->converter, OPENCC_CONVERSION_FAST);

	/* 加載默認辭典 */
	int retval;
	if (config_file == NULL)
		retval = 0;
	else
	{
		config_t config = config_open(config_file);

		if (config == (config_t) -1)
		{
			errnum = OPENCC_ERROR_CONFIG;
			return (opencc_t) -1;
		}

		opencc->dictionary_set = config_get_dictionary_set(config);
		converter_assign_dictionary(opencc->converter, opencc->dictionary_set);

		config_close(config);
	}

	return (opencc_t) opencc;
}